

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O2

void __thiscall
ConfusableMatcher::GetKeyMappings(ConfusableMatcher *this,string *In,StackVector<CMString> *Output)

{
  byte bVar1;
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *this_00;
  pointer pCVar2;
  CMString In_00;
  bool bVar3;
  pointer ppVar4;
  int x;
  ulong uVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  iterator valueIterator;
  iterator local_1068;
  StackVector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappingsStorage;
  
  StackVector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::StackVector(&mappingsStorage);
  if (In->_M_string_length == 0) {
    __assert_fail("In.size() >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0x7b,
                  "void ConfusableMatcher::GetKeyMappings(std::string, StackVector<CMString> &)");
  }
  bVar1 = *(In->_M_dataplus)._M_p;
  for (ppVar4 = this->TheMap[bVar1].
                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 != this->TheMap[bVar1].
                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
    uVar5 = (ppVar4->first).Len;
    if ((uVar5 <= In->_M_string_length) &&
       (__x._M_str = (ppVar4->first).Str, __x._M_len = uVar5, __y._M_str = (In->_M_dataplus)._M_p,
       __y._M_len = uVar5, bVar3 = std::experimental::fundamentals_v1::operator!=(__x,__y), !bVar3))
    {
      this_00 = &ppVar4->second->rep;
      google::
      dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
      ::begin(&valueIterator,this_00);
      while (google::
             dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
             ::end(&local_1068,this_00), valueIterator.pos != local_1068.pos) {
        lVar6 = 0;
        for (uVar5 = 0;
            pCVar2 = ((valueIterator.pos)->second->
                     super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar5 < (ulong)(((long)((valueIterator.pos)->second->
                                   super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pCVar2) / 0x18);
            uVar5 = uVar5 + 1) {
          In_00.Hash = *(size_t *)((long)&pCVar2->Hash + lVar6);
          In_00._0_16_ = *(undefined1 (*) [16])((long)&pCVar2->Str + lVar6);
          StackVector<CMString>::Push(Output,In_00);
          lVar6 = lVar6 + 0x18;
        }
        google::
        dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::operator++(&valueIterator);
      }
    }
  }
  StackVector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~StackVector(&mappingsStorage);
  return;
}

Assistant:

void ConfusableMatcher::GetKeyMappings(std::string In, StackVector<CMString> &Output)
{
	StackVector<std::pair<std::string, std::string>> mappingsStorage;

	assert(In.size() >= 1);

	// Find array of whole keys
	auto &keyArr = TheMap[(unsigned char)In[0]];

	for (auto keyIterator = keyArr.begin();keyIterator != keyArr.end();keyIterator++) {
		if (keyIterator->first.Len > In.size() || (keyIterator->first).View() != CMStringView(In.data(), keyIterator->first.Len))
			continue;

		// Whole key found, return value array
		auto values = keyIterator->second;

		for (auto valueIterator = values->begin();valueIterator != values->end();valueIterator++) {
			for (auto x = 0;x < valueIterator->second->size();x++)
				Output.Push((*(valueIterator->second))[x]);
		}
	}
}